

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::CleanAll(CompressedSubImageTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  CompressedSubImageTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_to != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to);
    this->m_to = 0;
  }
  if (this->m_to_aux != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_aux);
    this->m_to_aux = 0;
  }
  if (this->m_reference != (GLubyte *)0x0) {
    if (this->m_reference != (GLubyte *)0x0) {
      operator_delete__(this->m_reference);
    }
    this->m_reference = (GLubyte *)0x0;
  }
  if (this->m_result != (GLubyte *)0x0) {
    if (this->m_result != (GLubyte *)0x0) {
      operator_delete__(this->m_result);
    }
    this->m_result = (GLubyte *)0x0;
  }
  this->m_reference_size = 0;
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void CompressedSubImageTest::CleanAll()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Textures. */
	if (m_to)
	{
		gl.deleteTextures(1, &m_to);

		m_to = 0;
	}

	if (m_to_aux)
	{
		gl.deleteTextures(1, &m_to_aux);

		m_to_aux = 0;
	}

	/* Reference data storage. */
	if (DE_NULL != m_reference)
	{
		delete[] m_reference;

		m_reference = DE_NULL;
	}

	if (DE_NULL != m_result)
	{
		delete[] m_result;

		m_result = DE_NULL;
	}

	m_reference_size = 0;

	/* Errors. */
	while (GL_NO_ERROR != gl.getError())
		;
}